

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

void __thiscall
jbcoin::STObject::setFieldUsingSetValue<jbcoin::STBitString<128ul>,jbcoin::base_uint<128ul,void>>
          (STObject *this,SField *field,base_uint<128UL,_void> value)

{
  int iVar1;
  STBitString<128UL> *local_50;
  STBitString<128UL> *cf;
  STBase *rf;
  SField *field_local;
  STObject *this_local;
  base_uint<128UL,_void> value_local;
  
  value_local.pn._0_8_ = value.pn._8_8_;
  this_local = value.pn._0_8_;
  cf = (STBitString<128UL> *)getPField(this,field,true);
  if (cf == (STBitString<128UL> *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*(cf->super_STBase)._vptr_STBase[4])();
  if (iVar1 == 0) {
    cf = (STBitString<128UL> *)makeFieldPresent(this,field);
  }
  if (cf == (STBitString<128UL> *)0x0) {
    local_50 = (STBitString<128UL> *)0x0;
  }
  else {
    local_50 = (STBitString<128UL> *)
               __dynamic_cast(cf,&STBase::typeinfo,&STBitString<128ul>::typeinfo,0);
  }
  if (local_50 == (STBitString<128UL> *)0x0) {
    Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
  }
  STBitString<128UL>::setValue<void>(local_50,(base_uint<128UL,_void> *)&this_local);
  return;
}

Assistant:

void setFieldUsingSetValue (SField const& field, V value)
    {
        static_assert(!std::is_lvalue_reference<V>::value, "");

        STBase* rf = getPField (field, true);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        if (rf->getSType () == STI_NOTPRESENT)
            rf = makeFieldPresent (field);

        T* cf = dynamic_cast<T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        cf->setValue (std::move (value));
    }